

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

int Kit_TruthVarIsVacuous(uint *pOnset,uint *pOffset,int nVars,int iVar)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  uint *puVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint *puVar14;
  
  uVar10 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar10 = 1;
  }
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      uVar6 = 0;
      uVar13 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar13 = uVar6;
      }
      do {
        if (uVar13 == uVar6) {
          return 1;
        }
        puVar8 = pOnset + uVar6;
        puVar14 = pOffset + uVar6;
        uVar6 = uVar6 + 1;
      } while (((*puVar8 >> 1 & *puVar14 | *puVar14 >> 1 & *puVar8) & 0x55555555) == 0);
      break;
    case 1:
      uVar6 = 0;
      uVar13 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar13 = uVar6;
      }
      do {
        if (uVar13 == uVar6) {
          return 1;
        }
        puVar8 = pOnset + uVar6;
        puVar14 = pOffset + uVar6;
        uVar6 = uVar6 + 1;
      } while (((*puVar8 >> 2 & *puVar14 | *puVar14 >> 2 & *puVar8) & 0x33333333) == 0);
      break;
    case 2:
      uVar6 = 0;
      uVar13 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar13 = uVar6;
      }
      do {
        if (uVar13 == uVar6) {
          return 1;
        }
        puVar8 = pOnset + uVar6;
        puVar14 = pOffset + uVar6;
        uVar6 = uVar6 + 1;
      } while (((*puVar8 >> 4 & *puVar14 | *puVar14 >> 4 & *puVar8) & 0xf0f0f0f) == 0);
      break;
    case 3:
      uVar6 = 0;
      uVar13 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar13 = uVar6;
      }
      do {
        if (uVar13 == uVar6) {
          return 1;
        }
        puVar8 = pOnset + uVar6;
        puVar14 = pOffset + uVar6;
        uVar6 = uVar6 + 1;
      } while (((*puVar8 >> 8 & *puVar14 | *puVar14 >> 8 & *puVar8) & 0xff00ff) == 0);
      break;
    case 4:
      uVar6 = 0;
      uVar13 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar13 = uVar6;
      }
      do {
        if (uVar13 == uVar6) {
          return 1;
        }
        puVar8 = pOnset + uVar6;
        puVar14 = pOffset + uVar6;
        uVar6 = uVar6 + 1;
      } while ((*puVar8 >> 0x10 & *puVar14) == 0 && (*puVar14 >> 0x10 & *puVar8) == 0);
      break;
    default:
      bVar9 = (char)iVar - 5;
      bVar5 = bVar9 & 0x1f;
      uVar11 = 1 << bVar5;
      iVar7 = 2 << (bVar9 & 0x1f);
      iVar12 = 0 << bVar5;
      uVar13 = 0;
      if (0 < (int)uVar11) {
        uVar13 = (ulong)uVar11;
      }
      do {
        puVar8 = pOnset;
        puVar14 = pOffset;
        uVar6 = uVar13;
        if ((int)uVar10 <= iVar12) {
          return 1;
        }
        while (uVar6 != 0) {
          puVar1 = puVar14 + (int)uVar11;
          uVar3 = *puVar8;
          puVar2 = puVar8 + (int)uVar11;
          uVar4 = *puVar14;
          puVar8 = puVar8 + 1;
          puVar14 = puVar14 + 1;
          uVar6 = uVar6 - 1;
          if ((*puVar2 & uVar4) != 0 || (*puVar1 & uVar3) != 0) {
            return 0;
          }
        }
        iVar12 = iVar12 + iVar7;
        pOffset = pOffset + iVar7;
        pOnset = pOnset + iVar7;
      } while( true );
    }
    return 0;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                ,0x276,"int Kit_TruthVarIsVacuous(unsigned int *, unsigned int *, int, int)");
}

Assistant:

int Kit_TruthVarIsVacuous( unsigned * pOnset, unsigned * pOffset, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 1)) | (pOffset[i] & (pOnset[i] >> 1))) & 0x55555555 )
                 return 0;
        return 1;
    case 1:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 2)) | (pOffset[i] & (pOnset[i] >> 2))) & 0x33333333 )
                 return 0;
            return 1;
    case 2:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 4)) | (pOffset[i] & (pOnset[i] >> 4))) & 0x0F0F0F0F )
                 return 0;
        return 1;
    case 3:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 8)) | (pOffset[i] & (pOnset[i] >> 8))) & 0x00FF00FF )
                 return 0;
        return 1;
    case 4:
        for ( i = 0; i < nWords; i++ )
            if ( ((pOnset[i] & (pOffset[i] >> 16)) | (pOffset[i] & (pOnset[i] >> 16))) & 0x0000FFFF )
                 return 0;
        return 1;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( (pOnset[i] & pOffset[Step+i]) | (pOffset[i] & pOnset[Step+i]) )
                     return 0;
            pOnset += 2*Step;
            pOffset += 2*Step;
        }
        return 1;
    }
}